

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128>::on_hex
          (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128> *this)

{
  char cVar1;
  uint uVar2;
  basic_format_specs<char> *specs;
  ulong uVar3;
  buffer_appender<char> bVar4;
  ulong uVar5;
  ulong uVar6;
  int num_digits;
  bool bVar7;
  bool bVar8;
  string_view prefix;
  anon_class_48_3_ff6d91eb local_78;
  undefined1 auStack_48 [8];
  write_int_data<char> data;
  
  specs = this->specs;
  if ((char)specs->field_0x9 < '\0') {
    uVar2 = this->prefix_size;
    this->prefix_size = uVar2 + 1;
    this->prefix[uVar2] = '0';
    cVar1 = specs->type;
    uVar2 = this->prefix_size;
    this->prefix_size = uVar2 + 1;
    this->prefix[uVar2] = cVar1;
  }
  num_digits = 0;
  uVar5 = (ulong)this->abs_value;
  uVar6 = *(ulong *)((long)&this->abs_value + 8);
  do {
    num_digits = num_digits + 1;
    bVar7 = 0xf < uVar5;
    bVar8 = uVar6 != 0;
    uVar3 = -uVar6;
    uVar5 = uVar6 << 0x3c | uVar5 >> 4;
    uVar6 = uVar6 >> 4;
  } while (bVar8 || uVar3 < bVar7);
  data.padding = (size_t)(this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                         container;
  uVar2 = this->prefix_size;
  prefix.size_._0_4_ = uVar2;
  prefix.data_ = this->prefix;
  prefix.size_._4_4_ = 0;
  write_int_data<char>::write_int_data((write_int_data<char> *)auStack_48,num_digits,prefix,specs);
  local_78.data.size = (size_t)auStack_48;
  local_78.data.padding = data.size;
  local_78.prefix.data_ = this->prefix;
  local_78.prefix.size_ = (ulong)uVar2;
  local_78.f.this = this;
  local_78.f.num_digits = num_digits;
  bVar4 = write_padded<(fmt::v7::align::type)2,fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::write_int<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,char,unsigned__int128>::on_hex()::_lambda(fmt::v7::detail::buffer_appender<char>)_1_>(fmt::v7::detail::buffer_appender<char>,int,fmt::v7::basic_string_view<char>,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,char,unsigned__int128>::on_hex()::_lambda(fmt::v7::detail::buffer_appender<char>)_1_)::_lambda(fmt::v7::detail::buffer_appender<char>)_1_>
                    ((buffer_appender<char>)data.padding,specs,(size_t)auStack_48,(size_t)auStack_48
                     ,&local_78);
  (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
       (buffer<char> *)bVar4.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  return;
}

Assistant:

void on_hex() {
    if (specs.alt) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = specs.type;
    }
    int num_digits = count_digits<4>(abs_value);
    out = write_int(out, num_digits, get_prefix(), specs,
                    [this, num_digits](iterator it) {
                      return format_uint<4, Char>(it, abs_value, num_digits,
                                                  specs.type != 'x');
                    });
  }